

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

Comment * soul::SourceCodeUtilities::getFileSummaryComment
                    (Comment *__return_storage_ptr__,CodeLocation *file)

{
  bool bVar1;
  bool bVar2;
  Comment firstComment;
  Comment local_a0;
  CodeLocation local_60;
  CodeLocation local_50;
  CodeLocation local_40;
  CodeLocation local_30;
  
  local_50.sourceCode.object = (file->sourceCode).object;
  if (local_50.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_50.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_50.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_50.location.data = (file->location).data;
  parseComment(&local_a0,&local_50);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.sourceCode.object);
  bVar1 = local_a0.isDoxygenStyle;
  if (local_a0.isDoxygenStyle == true) {
    local_30.sourceCode.object = local_a0.range.end.sourceCode.object;
    if (local_a0.range.end.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_a0.range.end.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_a0.range.end.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_30.location.data = local_a0.range.end.location.data;
    bVar2 = isFollowedByBlankLine(&local_30);
  }
  else {
    bVar2 = false;
  }
  if (bVar1 != false) {
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_30.sourceCode.object);
  }
  if (bVar2 == false) {
    if (local_a0.valid == true) {
      local_60.sourceCode.object = local_a0.range.end.sourceCode.object;
      if (local_a0.range.end.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_a0.range.end.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_a0.range.end.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_60.location.data = local_a0.range.end.location.data;
      parseComment(__return_storage_ptr__,&local_60);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.sourceCode.object);
      bVar1 = __return_storage_ptr__->isDoxygenStyle;
      if (bVar1 == true) {
        local_40.sourceCode.object = (__return_storage_ptr__->range).end.sourceCode.object;
        if (local_40.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_40.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_40.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        local_40.location.data = (__return_storage_ptr__->range).end.location.data;
        bVar2 = isFollowedByBlankLine(&local_40);
      }
      else {
        bVar2 = false;
      }
      if (bVar1 != false) {
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_40.sourceCode.object);
      }
      if (bVar2 != false) goto LAB_001d0378;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                ((__return_storage_ptr__->range).end.sourceCode.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                ((__return_storage_ptr__->range).start.sourceCode.object);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&__return_storage_ptr__->lines);
    }
    __return_storage_ptr__->valid = false;
    __return_storage_ptr__->isStarSlash = false;
    __return_storage_ptr__->isDoxygenStyle = false;
    __return_storage_ptr__->isReferringBackwards = false;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->range).start.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).start.location.data = (char *)0x0;
    (__return_storage_ptr__->range).end.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).end.location.data = (char *)0x0;
  }
  else {
    __return_storage_ptr__->valid = local_a0.valid;
    __return_storage_ptr__->isStarSlash = local_a0.isStarSlash;
    __return_storage_ptr__->isDoxygenStyle = local_a0.isDoxygenStyle;
    __return_storage_ptr__->isReferringBackwards = local_a0.isReferringBackwards;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_a0.lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_a0.lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_a0.lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_a0.lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->range).start.sourceCode.object = local_a0.range.start.sourceCode.object
    ;
    local_a0.range.start.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).start.location.data = local_a0.range.start.location.data;
    (__return_storage_ptr__->range).end.sourceCode.object = local_a0.range.end.sourceCode.object;
    local_a0.range.end.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).end.location.data = local_a0.range.end.location.data;
  }
LAB_001d0378:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.range.end.sourceCode.object);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.range.start.sourceCode.object);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0.lines);
  return __return_storage_ptr__;
}

Assistant:

SourceCodeUtilities::Comment SourceCodeUtilities::getFileSummaryComment (CodeLocation file)
{
    auto firstComment = parseComment (file);

    if (firstComment.isDoxygenStyle && isFollowedByBlankLine (firstComment.range.end))
        return firstComment;

    if (firstComment.valid)
    {
        auto secondComment = parseComment (firstComment.range.end);

        if (secondComment.isDoxygenStyle && isFollowedByBlankLine (secondComment.range.end))
            return secondComment;
    }

    return {};
}